

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::RBCOMVisitor::visit(RBCOMVisitor *this,RigidBody *rb)

{
  double dVar1;
  element_type *peVar2;
  double *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *genData;
  shared_ptr<OpenMD::AtomData> *in_RSI;
  Vector3d pos;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  string *in_stack_fffffffffffffe78;
  AtomData *in_stack_fffffffffffffe80;
  StuntDouble *in_stack_fffffffffffffe88;
  StuntDouble *this_01;
  shared_ptr<OpenMD::GenericData> local_d8 [2];
  undefined1 local_b1 [105];
  Vector<double,_3U> local_48 [2];
  shared_ptr<OpenMD::AtomData> *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x352594);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3525a1);
  Vector3<double>::Vector3((Vector3<double> *)0x3525ae);
  StuntDouble::getPos(in_stack_fffffffffffffe88);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffe80,
             (Vector3<double> *)in_stack_fffffffffffffe78);
  std::make_shared<OpenMD::AtomInfo>();
  std::shared_ptr<OpenMD::AtomInfo>::operator=
            ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe80,
             (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe78);
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x35261f);
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x35262c);
  std::__cxx11::string::operator=((string *)peVar2,"X");
  pdVar3 = Vector<double,_3U>::operator[](local_48,0);
  dVar1 = *pdVar3;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x352678);
  pdVar3 = Vector<double,_3U>::operator[](&(peVar2->pos).super_Vector<double,_3U>,0);
  *pdVar3 = dVar1;
  pdVar3 = Vector<double,_3U>::operator[](local_48,1);
  dVar1 = *pdVar3;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3526e0);
  pdVar3 = Vector<double,_3U>::operator[](&(peVar2->pos).super_Vector<double,_3U>,1);
  *pdVar3 = dVar1;
  pdVar3 = Vector<double,_3U>::operator[](local_48,2);
  dVar1 = *pdVar3;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x35273c);
  pdVar3 = Vector<double,_3U>::operator[](&(peVar2->pos).super_Vector<double,_3U>,2);
  *pdVar3 = dVar1;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x352770);
  pdVar3 = Vector<double,_3U>::operator[](&(peVar2->vec).super_Vector<double,_3U>,0);
  *pdVar3 = 0.0;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x35279e);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Vector<double,_3U>::operator[](&(peVar2->vec).super_Vector<double,_3U>,1);
  *(double *)this_00 = 0.0;
  peVar2 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3527cf);
  pdVar3 = Vector<double,_3U>::operator[](&(peVar2->vec).super_Vector<double,_3U>,2);
  *pdVar3 = 0.0;
  std::make_shared<OpenMD::AtomData>();
  std::shared_ptr<OpenMD::AtomData>::operator=
            ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe80,
             (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffe78);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x35282b);
  genData = std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x352835);
  this_01 = (StuntDouble *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)pdVar3,(allocator<char> *)this_01);
  GenericData::setID(&in_stack_fffffffffffffe80->super_GenericData,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3528a2);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr
            ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe80,
             (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe78);
  AtomData::addAtomInfo
            (in_stack_fffffffffffffe80,(shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffe78);
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3528df);
  std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::AtomData,void>(local_d8,local_10);
  StuntDouble::addProperty(this_01,(shared_ptr<OpenMD::GenericData> *)genData);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x352922);
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x35292f);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x35293c);
  return;
}

Assistant:

void RBCOMVisitor::visit(RigidBody* rb) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    Vector3d pos;
    pos = rb->getPos();

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = 0;
    atomInfo->vec[1]       = 0;
    atomInfo->vec[2]       = 0;

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    rb->addProperty(atomData);
  }